

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O2

_Bool build_template(chunk *c,loc_conflict centre,wchar_t rating)

{
  byte bVar1;
  byte bVar2;
  char cVar3;
  room_template *prVar4;
  _Bool _Var5;
  uint32_t uVar6;
  wchar_t wVar7;
  uint uVar8;
  wchar_t wVar9;
  square *psVar10;
  loc_conflict lVar11;
  loc_conflict grid_00;
  room_template *prVar12;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  wchar_t wVar16;
  ulong uVar17;
  uint32_t uVar18;
  bool bVar19;
  loc_conflict grid;
  _Bool reflect;
  wchar_t local_a8;
  wchar_t local_a4;
  room_template *local_a0;
  uint32_t local_94;
  wchar_t txmax;
  wchar_t rotate;
  loc_conflict local_88;
  loc_conflict local_80;
  wchar_t local_74;
  wchar_t local_70;
  wchar_t tymax;
  char *local_68;
  char *local_60;
  ulong local_58;
  ulong local_50;
  wchar_t local_44;
  bitflag *local_40;
  char *local_38;
  
  uVar18 = 1;
  local_a0 = (room_template *)0x0;
  prVar12 = room_templates;
  do {
    if ((prVar12->typ == '\x01') && ((uint)prVar12->rat == rating)) {
      uVar6 = Rand_div(uVar18);
      if (uVar6 == 0) {
        local_a0 = prVar12;
      }
      uVar18 = uVar18 + 1;
    }
    prVar4 = local_a0;
    prVar12 = prVar12->next;
  } while (prVar12 != (room_template *)0x0);
  if (local_a0 == (room_template *)0x0) {
LAB_00153170:
    _Var5 = false;
  }
  else {
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,local_a0->name);
    local_a8 = (wchar_t)prVar4->hgt;
    bVar1 = prVar4->wid;
    wVar16 = (wchar_t)bVar1;
    bVar2 = prVar4->dor;
    pcVar13 = prVar4->text;
    local_44 = (wchar_t)prVar4->tval;
    local_80 = centre;
    if (c == (chunk *)0x0) {
      __assert_fail("c",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                    ,0x480,
                    "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                   );
    }
    local_58 = CONCAT44(local_58._4_4_,c->depth);
    local_88.x = Rand_div(0x19);
    uVar18 = Rand_div((uint)bVar2);
    local_68 = (char *)CONCAT44(local_68._4_4_,uVar18);
    local_94 = Rand_div(2);
    wVar9 = local_a8;
    local_a4 = (wchar_t)bVar1;
    local_60 = pcVar13;
    if ((centre.y < c->height) && (centre.x < c->width)) {
      get_random_symmetry_transform(local_a8,local_a4,L'\0',L'\0',&rotate,&reflect,&tymax,&txmax);
      wVar16 = local_a4;
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,tymax + L'\x02',txmax + L'\x02');
      if ((tymax != wVar9) ||
         (bVar19 = txmax != wVar16, pcVar13 = local_60, tymax = local_a8, txmax = wVar16,
         local_74 = centre.y, bVar19)) {
        __assert_fail("tymax == ymax && txmax == xmax",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                      ,0x49b,
                      "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                     );
      }
    }
    else {
      wVar7 = calc_default_transpose_weight(local_a8,local_a4);
      get_random_symmetry_transform(wVar9,wVar16,L'\0',wVar7,&rotate,&reflect,&tymax,&txmax);
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,tymax + L'\x02',txmax + L'\x02');
      _Var5 = find_space(&local_80,tymax + L'\x02',txmax + L'\x02');
      if (!_Var5) goto LAB_00153170;
      centre = (loc_conflict)((ulong)local_80 & 0xffffffff);
      local_74 = local_80.y;
    }
    local_40 = local_a0->flags;
    local_88.x = local_88.x + 1;
    local_70 = txmax / -2 + centre.x;
    local_74 = tymax / -2 + local_74;
    local_80.y = local_74;
    local_80.x = local_70;
    local_68 = (char *)CONCAT44(local_68._4_4_,(uint)local_68 + 0x31);
    local_50 = (ulong)(uint)wVar16;
    wVar16 = L'\0';
    pcVar14 = pcVar13;
    while ((wVar16 != local_a8 && (*pcVar13 != '\0'))) {
      local_38 = pcVar13 + local_50;
      lVar15 = 0;
      while( true ) {
        pcVar14 = local_38;
        if ((int)local_50 == (int)lVar15) break;
        if (pcVar13[lVar15] == '\0') {
          pcVar14 = pcVar13 + lVar15;
          break;
        }
        grid = loc((int)lVar15,wVar16);
        symmetry_transform(&grid,local_74,local_70,local_a8,local_a4,rotate,reflect);
        if (pcVar13[lVar15] == ' ') goto LAB_0015313f;
        square_set_feat((chunk_conflict *)c,(loc)grid,FEAT_FLOOR);
        _Var5 = square_isempty((chunk_conflict *)c,(loc)grid);
        if (!_Var5) {
          __assert_fail("square_isempty(c, grid)",
                        "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                        ,0x4b2,
                        "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                       );
        }
        uVar8 = (uint)(byte)pcVar13[lVar15];
        switch(pcVar13[lVar15]) {
        case '#':
switchD_00152fa0_caseD_23:
          goto LAB_00152ff3;
        case '$':
        case '&':
        case '\'':
        case '*':
        case ',':
        case '-':
        case '.':
        case '/':
        case '0':
        case '7':
          break;
        case '%':
          set_marked_granite(c,grid,L'\f');
          _Var5 = flag_has_dbg(local_40,1,1,"flags","ROOMF_FEW_ENTRANCES");
          if (_Var5) {
            append_entrance(grid);
          }
          break;
        case '(':
          if (local_94 == 0) {
LAB_00152fad:
            place_secret_door((chunk_conflict *)c,grid);
          }
          break;
        case ')':
          if (local_94 != 0) goto LAB_00152fad;
          goto LAB_00152ff3;
        case '+':
          place_closed_door((chunk_conflict *)c,grid);
          break;
        case '1':
        case '2':
        case '3':
        case '4':
        case '5':
        case '6':
          if ((uint)local_68 == uVar8) goto LAB_00152fad;
LAB_00152ff3:
          set_marked_granite(c,grid,L'\r');
          break;
        case '8':
          uVar18 = Rand_div(100);
          if (((int)uVar18 < 0x50) || (dun->persist == true)) {
            wVar9 = c->depth;
            wVar7 = L'\0';
LAB_001530d0:
            place_object((chunk_conflict *)c,grid,wVar9,false,false,'\x03',wVar7);
          }
          else {
            place_random_stairs((chunk_conflict *)c,grid);
          }
          break;
        default:
          if (uVar8 == 0x5b) {
            wVar9 = c->depth;
            wVar7 = local_44;
            goto LAB_001530d0;
          }
          if (uVar8 == 0x5e) {
            uVar18 = Rand_div(4);
            if (uVar18 == 0) {
              place_trap(c,(loc)grid,L'\xffffffff',c->depth);
            }
          }
          else if ((uVar8 == 0x78) && (local_94 == 0)) goto switchD_00152fa0_caseD_23;
        }
        psVar10 = square((chunk_conflict *)c,(loc)grid);
        flag_on_dbg(psVar10->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
        if ((int)local_58 <= local_88.x) {
          psVar10 = square((chunk_conflict *)c,(loc)grid);
          flag_on_dbg(psVar10->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
        }
LAB_0015313f:
        lVar15 = lVar15 + 1;
      }
      wVar16 = wVar16 + L'\x01';
      pcVar13 = pcVar14;
      pcVar14 = local_60;
    }
    uVar17 = 0;
    wVar16 = local_a4;
    while (((wchar_t)uVar17 != local_a8 && (*pcVar14 != '\0'))) {
      local_68 = pcVar14 + local_50;
      lVar15 = 0;
      local_60 = pcVar14;
      local_58 = uVar17;
      while( true ) {
        pcVar13 = local_68;
        if ((int)local_50 == (int)lVar15) break;
        if (pcVar14[lVar15] == '\0') {
          pcVar13 = pcVar14 + lVar15;
          break;
        }
        grid = loc((int)lVar15,(int)uVar17);
        symmetry_transform(&grid,local_74,local_70,local_a8,wVar16,rotate,reflect);
        cVar3 = pcVar14[lVar15];
        if (cVar3 == '9') {
          local_88 = loc(2,-2);
          lVar11 = loc(3,3);
          _Var5 = square_isroom((chunk_conflict *)c,(loc)grid);
          if ((!_Var5) || (_Var5 = square_isfloor((chunk_conflict *)c,(loc)grid), !_Var5)) {
            __assert_fail("square_isroom(c, grid) && square_isfloor(c, grid)",
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                          ,0x538,
                          "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                         );
          }
          grid_00 = loc_diff(grid,lVar11);
          wVar16 = c->depth;
          uVar18 = Rand_div(2);
          uVar6 = Rand_div(2);
          vault_monsters((chunk_conflict *)c,grid_00,wVar16 + uVar18,uVar6 + L'\x01');
          lVar11 = loc_sum(grid,lVar11);
          wVar16 = c->depth;
          uVar18 = Rand_div(2);
          uVar6 = Rand_div(2);
          vault_monsters((chunk_conflict *)c,lVar11,wVar16 + uVar18,uVar6 + L'\x01');
          uVar18 = Rand_div(2);
          if (uVar18 == 0) {
            lVar11 = loc_sum(grid,local_88);
            wVar16 = c->depth;
            uVar18 = Rand_div(2);
            vault_objects((chunk_conflict *)c,lVar11,wVar16,uVar18 + L'\x01');
          }
          uVar18 = Rand_div(2);
          pcVar14 = local_60;
          wVar16 = local_a4;
          uVar17 = local_58;
          if (uVar18 == 0) {
            lVar11 = loc_diff(grid,local_88);
            wVar9 = c->depth;
            uVar18 = Rand_div(2);
            uVar17 = local_58;
            vault_objects((chunk_conflict *)c,lVar11,wVar9,uVar18 + L'\x01');
          }
        }
        else if (cVar3 == '8') {
          _Var5 = square_isroom((chunk_conflict *)c,(loc)grid);
          if ((!_Var5) ||
             ((_Var5 = square_isfloor((chunk_conflict *)c,(loc)grid), !_Var5 &&
              (_Var5 = square_isstairs((chunk_conflict *)c,(loc)grid), !_Var5)))) {
            __assert_fail("square_isroom(c, grid) && (square_isfloor(c, grid) || square_isstairs(c, grid))"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                          ,0x52a,
                          "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                         );
          }
          wVar9 = c->depth;
          uVar18 = Rand_div(2);
          vault_monsters((chunk_conflict *)c,grid,wVar9 + L'\x02',uVar18 + L'\x03');
        }
        else if (cVar3 == '#') {
          _Var5 = square_isroom((chunk_conflict *)c,(loc)grid);
          if ((!_Var5) || (_Var5 = square_isgranite((chunk_conflict *)c,(loc)grid), !_Var5)) {
LAB_001534ee:
            __assert_fail("square_isroom(c, grid) && square_isgranite(c, grid) && sqinfo_has(square(c, grid)->info, SQUARE_WALL_SOLID)"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                          ,0x518,
                          "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                         );
          }
          psVar10 = square((chunk_conflict *)c,(loc)grid);
          _Var5 = flag_has_dbg(psVar10->info,3,0xd,"square(c, grid)->info","SQUARE_WALL_SOLID");
          if (!_Var5) goto LAB_001534ee;
          wVar9 = count_neighbors((loc *)0x0,(chunk_conflict *)c,(loc)grid,square_isroom,false);
          if (wVar9 == L'\b') {
            psVar10 = square((chunk_conflict *)c,(loc)grid);
            flag_off(psVar10->info,3,0xd);
            psVar10 = square((chunk_conflict *)c,(loc)grid);
            flag_on_dbg(psVar10->info,3,0xb,"square(c, grid)->info","SQUARE_WALL_INNER");
          }
        }
        lVar15 = lVar15 + 1;
      }
      uVar17 = (ulong)((int)uVar17 + 1);
      pcVar14 = pcVar13;
    }
    _Var5 = true;
    if ((player->opts).opt[0x18] == true) {
      msg("Room template (%s)",local_a0->name);
    }
  }
  return _Var5;
}

Assistant:

bool build_template(struct chunk *c, struct loc centre, int rating)
{
	/* All room templates currently have type 1 */
	return build_room_template_type(c, centre, 1, rating);
}